

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiffInfo.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* ApprovalTests::DiffInfo::getProgramFileLocations_abi_cxx11_(void)

{
  initializer_list<const_char_*> __l;
  bool bVar1;
  ulong uVar2;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RDI;
  string envVarValue;
  char **envVar;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  vector<const_char_*,_std::allocator<const_char_*>_> envVars;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *possibleWindowsPaths;
  vector<const_char_*,_std::allocator<const_char_*>_> *__lhs;
  value_type *__x;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_ffffffffffffff50;
  allocator_type *in_stack_ffffffffffffff68;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_ffffffffffffff70;
  iterator in_stack_ffffffffffffff78;
  __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  in_stack_ffffffffffffff80;
  undefined1 local_59;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char **local_38;
  undefined8 local_30;
  byte local_9;
  
  local_9 = 0;
  __lhs = in_RDI;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x165a28);
  local_48 = "ProgramFiles(x86)";
  local_58 = "ProgramFiles";
  pcStack_50 = "ProgramW6432";
  local_38 = &local_58;
  local_30 = 3;
  __x = (value_type *)&local_59;
  ::std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x165a6b);
  __l._M_len = (size_type)in_stack_ffffffffffffff80._M_current;
  __l._M_array = in_stack_ffffffffffffff78;
  ::std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (in_stack_ffffffffffffff70,__l,in_stack_ffffffffffffff68);
  ::std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0x165a99);
  ::std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(in_RDI);
  ::std::vector<const_char_*,_std::allocator<const_char_*>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                        *)__lhs,(__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                 *)in_RDI);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
    ::operator*((__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                 *)&stack0xffffffffffffff80);
    SystemUtils::safeGetEnv_abi_cxx11_((char *)__x);
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      ::std::__cxx11::string::operator+=((string *)&stack0xffffffffffffff50,'\\');
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff50,__x);
    }
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
    __gnu_cxx::
    __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
    ::operator++((__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                  *)&stack0xffffffffffffff80);
  }
  local_9 = 1;
  ::std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(in_stack_ffffffffffffff50);
  if ((local_9 & 1) == 0) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffff50);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)__lhs;
}

Assistant:

std::vector<std::string> DiffInfo::getProgramFileLocations()
    {
        std::vector<std::string> possibleWindowsPaths;
        const std::vector<const char*> envVars = {
            "ProgramFiles", "ProgramW6432", "ProgramFiles(x86)"};

        for (const auto& envVar : envVars)
        {
            std::string envVarValue = SystemUtils::safeGetEnv(envVar);
            if (!envVarValue.empty())
            {
                envVarValue += '\\';
                possibleWindowsPaths.push_back(envVarValue);
            }
        }
        return possibleWindowsPaths;
    }